

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2AttributeDecl
               (void *ctx,xmlChar *elem,xmlChar *fullname,int type,int def,xmlChar *defaultValue,
               xmlEnumerationPtr tree)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  xmlChar *str1;
  xmlAttributePtr attr;
  xmlDtdPtr dtd;
  undefined4 in_register_00000084;
  xmlChar *str2;
  xmlChar *prefix;
  
  str2 = (xmlChar *)CONCAT44(in_register_00000084,def);
  prefix = (xmlChar *)0x0;
  if ((ctx != (void *)0x0) && (*(long *)((long)ctx + 0x10) != 0)) {
    iVar2 = xmlStrEqual(fullname,(xmlChar *)"xml:id");
    if ((type != 2) && (iVar2 != 0)) {
      uVar1 = *(undefined4 *)((long)ctx + 0x98);
      str2 = (xmlChar *)0x0;
      xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_XMLID_TYPE,"xml:id : attribute type should be ID\n",
                  (char *)0x0,(char *)0x0);
      *(undefined4 *)((long)ctx + 0x98) = uVar1;
    }
    str1 = xmlSplitQName((xmlParserCtxtPtr)ctx,fullname,&prefix);
    *(undefined4 *)((long)ctx + 0xe0) = 1;
    if (*(int *)((long)ctx + 0x150) == 2) {
      dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58);
    }
    else {
      if (*(int *)((long)ctx + 0x150) != 1) {
        xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_INTERNAL_ERROR,
                       "SAX.xmlSAX2AttributeDecl(%s) called while not in subset\n",str1,str2);
        (*xmlFree)(str1);
        xmlFreeEnumeration(tree);
        return;
      }
      dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50);
    }
    attr = xmlAddAttributeDecl((xmlValidCtxtPtr)((long)ctx + 0xa0),dtd,elem,str1,prefix,type,def,
                               defaultValue,tree);
    if (*(int *)((long)ctx + 0xe0) == 0) {
      *(undefined4 *)((long)ctx + 0x98) = 0;
    }
    if ((((attr != (xmlAttributePtr)0x0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
        (*(int *)((long)ctx + 0x18) != 0)) &&
       ((*(xmlDocPtr *)((long)ctx + 0x10))->intSubset != (_xmlDtd *)0x0)) {
      uVar3 = xmlValidateAttributeDecl
                        ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),attr);
      *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar3;
    }
    if (prefix != (xmlChar *)0x0) {
      (*xmlFree)(prefix);
    }
    if (str1 != (xmlChar *)0x0) {
      (*xmlFree)(str1);
    }
  }
  return;
}

Assistant:

void
xmlSAX2AttributeDecl(void *ctx, const xmlChar *elem, const xmlChar *fullname,
              int type, int def, const xmlChar *defaultValue,
	      xmlEnumerationPtr tree)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlAttributePtr attr;
    xmlChar *name = NULL, *prefix = NULL;

    /* Avoid unused variable warning if features are disabled. */
    (void) attr;

    if ((ctxt == NULL) || (ctxt->myDoc == NULL))
        return;

#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2AttributeDecl(%s, %s, %d, %d, %s, ...)\n",
            elem, fullname, type, def, defaultValue);
#endif
    if ((xmlStrEqual(fullname, BAD_CAST "xml:id")) &&
        (type != XML_ATTRIBUTE_ID)) {
	/*
	 * Raise the error but keep the validity flag
	 */
	int tmp = ctxt->valid;
	xmlErrValid(ctxt, XML_DTD_XMLID_TYPE,
	      "xml:id : attribute type should be ID\n", NULL, NULL);
	ctxt->valid = tmp;
    }
    /* TODO: optimize name/prefix allocation */
    name = xmlSplitQName(ctxt, fullname, &prefix);
    ctxt->vctxt.valid = 1;
    if (ctxt->inSubset == 1)
	attr = xmlAddAttributeDecl(&ctxt->vctxt, ctxt->myDoc->intSubset, elem,
	       name, prefix, (xmlAttributeType) type,
	       (xmlAttributeDefault) def, defaultValue, tree);
    else if (ctxt->inSubset == 2)
	attr = xmlAddAttributeDecl(&ctxt->vctxt, ctxt->myDoc->extSubset, elem,
	   name, prefix, (xmlAttributeType) type,
	   (xmlAttributeDefault) def, defaultValue, tree);
    else {
        xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
	     "SAX.xmlSAX2AttributeDecl(%s) called while not in subset\n",
	               name, NULL);
	xmlFree(name);
	xmlFreeEnumeration(tree);
	return;
    }
#ifdef LIBXML_VALID_ENABLED
    if (ctxt->vctxt.valid == 0)
	ctxt->valid = 0;
    if ((attr != NULL) && (ctxt->validate) && (ctxt->wellFormed) &&
        (ctxt->myDoc->intSubset != NULL))
	ctxt->valid &= xmlValidateAttributeDecl(&ctxt->vctxt, ctxt->myDoc,
	                                        attr);
#endif /* LIBXML_VALID_ENABLED */
    if (prefix != NULL)
	xmlFree(prefix);
    if (name != NULL)
	xmlFree(name);
}